

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

int __thiscall
Gudhi::Persistence_representations::Persistence_landscape::abs(Persistence_landscape *this,int __x)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  size_t i;
  long lVar4;
  long lVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  long lVar7;
  long lVar8;
  pair<double,_double> p1;
  pair<double,_double> p2;
  pair<double,_double> local_78;
  Persistence_landscape *local_60;
  long local_58;
  double local_50;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> lambda_n;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__x);
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->number_of_functions_for_vectorization = 0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->number_of_functions_for_projections_to_reals = 0;
  lVar5 = 0;
  local_60 = this;
  while (lVar5 != (plVar6[1] - *plVar6) / 0x18) {
    if (AbsDbg == '\x01') {
      poVar3 = std::operator<<((ostream *)&std::clog,"level: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lambda_n.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lambda_n.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lambda_n.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.first = -2147483647.0;
    local_78.second = 0.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &lambda_n,&local_78);
    lVar7 = lVar5 * 0x18;
    lVar8 = 0;
    local_58 = lVar5;
    for (lVar4 = 1; lVar5 = *(long *)(*plVar6 + lVar7),
        lVar4 != *(long *)(*plVar6 + 8 + lVar7) - lVar5 >> 4; lVar4 = lVar4 + 1) {
      if (AbsDbg == '\x01') {
        poVar3 = std::operator<<((ostream *)&std::clog,"this->land[");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,"][");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"] : ");
        poVar3 = std::ostream::_M_insert<double>
                           (*(double *)(*(long *)(*plVar6 + lVar7) + 0x10 + lVar8));
        std::operator<<(poVar3," ");
        poVar3 = std::ostream::_M_insert<double>
                           (*(double *)(*(long *)(*plVar6 + lVar7) + 0x18 + lVar8));
        std::endl<char,std::char_traits<char>>(poVar3);
        lVar5 = *(long *)(*plVar6 + lVar7);
      }
      dVar1 = *(double *)(lVar5 + 8 + lVar8);
      dVar2 = *(double *)(lVar5 + 0x18 + lVar8);
      if (0.0 <= dVar1 * dVar2) {
        local_78.second = ABS(dVar2);
        local_78.first = *(double *)(lVar5 + 0x10 + lVar8);
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &lambda_n,&local_78);
        if (AbsDbg == '\x01') {
          std::operator<<((ostream *)&std::clog,"Adding pair : (");
          poVar3 = std::ostream::_M_insert<double>
                             (*(double *)(*(long *)(*plVar6 + lVar7) + 0x10 + lVar8));
          std::operator<<(poVar3,",");
          poVar3 = std::ostream::_M_insert<double>
                             (ABS(*(double *)(*(long *)(*plVar6 + lVar7) + 0x18 + lVar8)));
          poVar3 = std::operator<<(poVar3,") ");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::istream::ignore();
        }
      }
      else {
        p1.second = dVar1;
        p1.first = *(double *)(lVar5 + lVar8);
        p2.second = dVar2;
        p2.first = *(double *)(lVar5 + 0x10 + lVar8);
        local_78.first = find_zero_of_a_line_segment_between_those_two_points(p1,p2);
        local_78.second = 0.0;
        local_50 = local_78.first;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &lambda_n,&local_78);
        local_78.first = *(double *)(*(long *)(*plVar6 + lVar7) + 0x10 + lVar8);
        local_78.second = ABS(*(double *)(*(long *)(*plVar6 + lVar7) + 0x18 + lVar8));
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &lambda_n,&local_78);
        if (AbsDbg == '\x01') {
          std::operator<<((ostream *)&std::clog,"Adding pair : (");
          poVar3 = std::ostream::_M_insert<double>(local_50);
          poVar3 = std::operator<<(poVar3,",0)");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::operator<<((ostream *)&std::clog,"In the same step adding pair : (");
          poVar3 = std::ostream::_M_insert<double>
                             (*(double *)(*(long *)(*plVar6 + lVar7) + 0x10 + lVar8));
          std::operator<<(poVar3,",");
          poVar3 = std::ostream::_M_insert<double>
                             (ABS(*(double *)(*(long *)(*plVar6 + lVar7) + 0x18 + lVar8)));
          poVar3 = std::operator<<(poVar3,") ");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::istream::ignore();
        }
      }
      lVar8 = lVar8 + 0x10;
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::push_back(&local_60->land,(value_type *)&lambda_n);
    std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
    ~_Vector_base((_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   *)&lambda_n);
    lVar5 = local_58 + 1;
  }
  return (int)local_60;
}

Assistant:

Persistence_landscape Persistence_landscape::abs() {
  Persistence_landscape result;
  for (size_t level = 0; level != this->land.size(); ++level) {
    if (AbsDbg) {
      std::clog << "level: " << level << std::endl;
    }
    std::vector<std::pair<double, double> > lambda_n;
    lambda_n.push_back(std::make_pair(-std::numeric_limits<int>::max(), 0));
    for (size_t i = 1; i != this->land[level].size(); ++i) {
      if (AbsDbg) {
        std::clog << "this->land[" << level << "][" << i << "] : " << this->land[level][i].first << " "
                  << this->land[level][i].second << std::endl;
      }
      // if a line segment between this->land[level][i-1] and this->land[level][i] crosses the x-axis, then we have to
      // add one landscape point t o result
      if ((this->land[level][i - 1].second) * (this->land[level][i].second) < 0) {
        double zero =
            find_zero_of_a_line_segment_between_those_two_points(this->land[level][i - 1], this->land[level][i]);

        lambda_n.push_back(std::make_pair(zero, 0));
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << zero << ",0)" << std::endl;
          std::clog << "In the same step adding pair : (" << this->land[level][i].first << ","
                    << fabs(this->land[level][i].second) << ") " << std::endl;
          std::cin.ignore();
        }
      } else {
        lambda_n.push_back(std::make_pair(this->land[level][i].first, fabs(this->land[level][i].second)));
        if (AbsDbg) {
          std::clog << "Adding pair : (" << this->land[level][i].first << "," << fabs(this->land[level][i].second)
                    << ") " << std::endl;
          std::cin.ignore();
        }
      }
    }
    result.land.push_back(lambda_n);
  }
  return result;
}